

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators_test.cpp
# Opt level: O3

void CheckSceneAverage(string *filename,float expected)

{
  bool bVar1;
  Allocator alloc;
  undefined8 uVar2;
  int c;
  int c_00;
  char *pcVar3;
  char *in_R9;
  ulong uVar4;
  long lVar5;
  Float FVar6;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  optional<pbrt::ImageAndMetadata> im;
  int in_stack_fffffffffffffc58;
  int iVar7;
  undefined4 in_stack_fffffffffffffc5c;
  undefined4 in_stack_fffffffffffffc60;
  float in_stack_fffffffffffffc64;
  Message local_398;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  abs_error;
  AssertHelper in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  ColorEncodingHandle local_370;
  undefined1 local_368 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_330;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_310;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_2f0;
  bool local_2cc;
  bool local_288;
  bool local_244;
  bool local_230;
  bool local_224;
  bool local_21c;
  bool local_214;
  bool local_208;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_200;
  optional<pbrt::ImageAndMetadata> local_1d0;
  
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_370.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  pbrt::Image::Read((ImageAndMetadata *)local_368,filename,alloc,&local_370);
  local_1d0.set = true;
  pbrt::ImageAndMetadata::ImageAndMetadata
            ((ImageAndMetadata *)&local_1d0,(ImageAndMetadata *)local_368);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_200);
  if (local_208 == true) {
    local_208 = false;
  }
  if (local_214 == true) {
    local_214 = false;
  }
  if (local_21c == true) {
    local_21c = false;
  }
  if (local_224 == true) {
    local_224 = false;
  }
  if (local_230 == true) {
    local_230 = false;
  }
  if (local_244 == true) {
    local_244 = false;
  }
  if (local_288 == true) {
    local_288 = false;
  }
  if (local_2cc == true) {
    local_2cc = false;
  }
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_2f0);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&local_310);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector(&local_330)
  ;
  pstd::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_358);
  local_398.ss_.ptr_._0_4_ = CONCAT31(local_398.ss_.ptr_._1_3_,local_1d0.set);
  abs_error.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1d0.set == false) {
    testing::Message::Message((Message *)&stack0xfffffffffffffc58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_368,(internal *)&local_398,(AssertionResult *)"(bool)im","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffc78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators_test.cpp"
               ,0x34,(char *)CONCAT71(local_368._1_7_,local_368[0]));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffc78,(Message *)&stack0xfffffffffffffc58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc78);
    if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT71(local_368._1_7_,local_368[0]) != &local_358) {
      operator_delete((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT71(local_368._1_7_,local_368[0]),
                      (ulong)((long)local_358.alloc.memoryResource + 1));
    }
    if (((CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58) != 0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       ((long *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58) + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&stack0xfffffffffffffc70,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&stack0xfffffffffffffc70,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_1d0.set == false) {
      pbrt::LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
    }
    iVar7 = 3;
    local_398.ss_.ptr_._0_4_ = local_1d0.optionalValue._40_4_;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_368,"im->image.NChannels()","3",(int *)&local_398,
               (int *)&stack0xfffffffffffffc58);
    if (local_368[0] == (internal)0x0) {
      testing::Message::Message(&local_398);
      if ((undefined8 *)local_368._8_8_ == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_368._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffc58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators_test.cpp"
                 ,0x35,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffc58,&local_398);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc58);
      if (((CONCAT44(local_398.ss_.ptr_._4_4_,local_398.ss_.ptr_._0_4_) != 0) &&
          (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
         ((long *)CONCAT44(local_398.ss_.ptr_._4_4_,local_398.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_398.ss_.ptr_._4_4_,local_398.ss_.ptr_._0_4_) + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_368 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_368 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_1d0.set != true) {
        pbrt::LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
      }
      if (0 < (int)((ulong)local_1d0.optionalValue._4_8_ >> 0x20)) {
        lVar5 = 0;
        in_stack_fffffffffffffc64 = 0.0;
        uVar2 = local_1d0.optionalValue._4_8_;
        do {
          if (0 < (int)uVar2) {
            uVar4 = 0;
            do {
              c_00 = 0;
              do {
                FVar6 = pbrt::Image::GetChannel
                                  ((Image *)&local_1d0,(Point2i)(lVar5 << 0x20 | uVar4),c_00,
                                   (WrapMode2D)0x200000002);
                c_00 = c_00 + 1;
                in_stack_fffffffffffffc64 = in_stack_fffffffffffffc64 + FVar6;
              } while (c_00 != 3);
              uVar4 = uVar4 + 1;
              uVar2 = local_1d0.optionalValue._4_8_;
            } while ((long)uVar4 < (long)(int)local_1d0.optionalValue._4_8_);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < (long)uVar2 >> 0x20);
      }
      testing::internal::DoubleNearPredFormat
                ((char *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                 (char *)CONCAT44(in_stack_fffffffffffffc5c,iVar7),(char *)0x277997,
                 (double)CONCAT44(expected,in_stack_fffffffffffffc80),
                 (double)in_stack_fffffffffffffc78.data_,(double)abs_error.ptr_);
      if (local_368[0] == (internal)0x0) {
        testing::Message::Message(&local_398);
        if ((undefined8 *)local_368._8_8_ == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_368._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffc58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators_test.cpp"
                   ,0x40,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffc58,&local_398);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc58);
        if (((CONCAT44(local_398.ss_.ptr_._4_4_,local_398.ss_.ptr_._0_4_) != 0) &&
            (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
           ((long *)CONCAT44(local_398.ss_.ptr_._4_4_,local_398.ss_.ptr_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_398.ss_.ptr_._4_4_,local_398.ss_.ptr_._0_4_) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_368 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  pstd::optional<pbrt::ImageAndMetadata>::reset(&local_1d0);
  return;
}

Assistant:

void CheckSceneAverage(const std::string &filename, float expected) {
    pstd::optional<ImageAndMetadata> im = Image::Read(filename);
    ASSERT_TRUE((bool)im);
    ASSERT_EQ(im->image.NChannels(), 3);

    float delta = .025;
    float sum = 0;

    Image &image = im->image;
    for (int t = 0; t < image.Resolution()[1]; ++t)
        for (int s = 0; s < image.Resolution()[0]; ++s)
            for (int c = 0; c < 3; ++c)
                sum += image.GetChannel(Point2i(s, t), c);
    int nPixels = image.Resolution().x * image.Resolution().y * 3;
    EXPECT_NEAR(expected, sum / nPixels, delta);
}